

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

uint64_t aom_mse_wxh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  int in_R8D;
  int in_stack_00000140;
  int in_stack_00000144;
  uint16_t *in_stack_00000148;
  int in_stack_00000154;
  uint8_t *in_stack_00000158;
  int in_stack_000001a0;
  int in_stack_000001a4;
  uint16_t *in_stack_000001a8;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  undefined8 local_8;
  
  if (in_R8D == 4) {
    local_8 = mse_4xh_16bit_avx2(in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,
                                 in_stack_000001a4,in_stack_000001a0);
  }
  else if (in_R8D == 8) {
    local_8 = mse_8xh_16bit_avx2(in_stack_00000158,in_stack_00000154,in_stack_00000148,
                                 in_stack_00000144,in_stack_00000140);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t aom_mse_wxh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                int sstride, int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  switch (w) {
    case 4: return mse_4xh_16bit_avx2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_avx2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}